

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O0

void __thiscall
Function::Function(Function *this,TypeName *returnType,ArgumentsList *arguments,
                  shared_ptr<BlockNode> *body,Context *context)

{
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *in_RCX;
  undefined4 *in_RSI;
  Value *in_RDI;
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  *in_R8;
  Context *in_stack_ffffffffffffff98;
  TypeName *this_00;
  TypeName local_2c;
  
  local_2c = Function;
  Value::Value(in_RDI,&local_2c);
  in_RDI->_vptr_Value = (_func_int **)&PTR__Function_001aec60;
  *(undefined4 *)&in_RDI->field_0xc = *in_RSI;
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeName>_>_>
  ::list(in_RCX,in_R8);
  this_00 = &in_RDI[2].valueType_;
  std::shared_ptr<BlockNode>::shared_ptr
            ((shared_ptr<BlockNode> *)this_00,(shared_ptr<BlockNode> *)in_stack_ffffffffffffff98);
  Context::Context((Context *)this_00,in_stack_ffffffffffffff98);
  return;
}

Assistant:

Function(const TypeName& returnType, const ArgumentsList& arguments, std::shared_ptr<BlockNode> body, const Context& context):
    Value(TypeName::Function), returnType_(returnType), arguments_(arguments), body_(body), context_(context) {}